

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O0

Clause * performRewriting(Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
                         Literal *eqLit,TermList eqLHS,ResultSubstitutionSP *subst,
                         DemodulationHelper *helper,bool *isEqTautology,Inference *inf)

{
  Literal *pLVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  ResultSubstitution *pRVar5;
  undefined4 extraout_var;
  Stack<Kernel::Literal_*> *lits;
  Elem ppLVar6;
  undefined8 in_RDX;
  Literal *in_RSI;
  Literal *in_R8;
  undefined8 in_R9;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_00000008;
  long in_stack_00000010;
  undefined1 *in_stack_00000018;
  Literal *currAfter;
  Literal *curr_1;
  StlIter __end1_1;
  StlIter __begin1_1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1_1;
  Literal *curr;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  RStack<Literal_*> resLits;
  Literal *tgtLitS;
  Applicator appl;
  TermList tgtTermS;
  TermList tgtTerm;
  TermList in_stack_fffffffffffffdc8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffdd0;
  TermList in_stack_fffffffffffffdd8;
  TermList in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined7 in_stack_fffffffffffffe38;
  Clause *in_stack_fffffffffffffe68;
  DemodulationHelper *in_stack_fffffffffffffe70;
  TermList in_stack_fffffffffffffe78;
  TermList in_stack_fffffffffffffe80;
  TermList in_stack_fffffffffffffe88;
  SubstApplicator *in_stack_fffffffffffffea0;
  undefined1 local_130 [24];
  undefined1 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  Literal *local_100;
  undefined1 local_d8 [24];
  undefined1 *local_c0;
  undefined8 local_a8;
  undefined8 local_a0;
  Literal *local_98;
  undefined4 local_90;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  StlIter local_68;
  uint64_t local_58;
  undefined8 local_50;
  uint64_t local_40;
  Literal *local_38;
  Literal *local_28;
  undefined8 local_18;
  undefined8 local_10;
  Clause *local_8;
  
  local_38 = in_R8;
  local_28 = in_RSI;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_40 = (uint64_t)
             Kernel::EqHelper::getOtherEqualitySide((Literal *)0x7bb2c4,in_stack_fffffffffffffdc8);
  pRVar5 = Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_stack_00000008);
  local_58 = local_40;
  iVar4 = (*pRVar5->_vptr_ResultSubstitution[0xf])(pRVar5,local_40);
  local_50 = CONCAT44(extraout_var,iVar4);
  Lib::SmartPtr<Indexing::ResultSubstitution>::ptr(in_stack_00000008);
  anon_unknown.dwarf_d58a04::Applicator::Applicator
            ((Applicator *)in_stack_fffffffffffffdd0,
             (ResultSubstitution *)in_stack_fffffffffffffdc8._content);
  if (in_stack_00000010 != 0) {
    local_70 = local_10;
    local_78 = local_50;
    local_80 = local_18;
    in_stack_fffffffffffffdc8._content = (uint64_t)&local_68;
    bVar2 = Inferences::DemodulationHelper::isPremiseRedundant
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (Literal *)in_stack_00000008,in_stack_fffffffffffffe88,
                       in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffea0
                      );
    if (!bVar2) {
      local_8 = (Clause *)0x0;
      local_90 = 1;
      goto LAB_007bb8a7;
    }
  }
  local_a0 = local_10;
  local_a8 = local_50;
  local_98 = Kernel::EqHelper::replace
                       ((Literal *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
  bVar2 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffdd0);
  if (bVar2) {
    *in_stack_00000018 = 1;
    local_8 = (Clause *)0x0;
    local_90 = 1;
  }
  else {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
             )in_stack_fffffffffffffdd0);
    lits = Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x7bb4a9);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_fffffffffffffdd0,(Literal *)in_stack_fffffffffffffdc8._content);
    Kernel::Clause::iterLits((Clause *)in_stack_fffffffffffffde0._content);
    local_c0 = local_d8;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
             *)in_stack_fffffffffffffdc8._content);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_fffffffffffffdc8._content);
    while (uVar3 = Lib::operator!=((StlIter *)in_stack_fffffffffffffdd0,
                                   (StlIter *)in_stack_fffffffffffffdc8._content), (bool)uVar3) {
      ppLVar6 = Lib::
                IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
                ::StlIter::operator*((StlIter *)0x7bb550);
      local_100 = *ppLVar6;
      if (local_100 != local_28) {
        local_108 = local_10;
        local_110 = local_50;
        local_100 = Kernel::EqHelper::replace
                              ((Literal *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffde0,
                               in_stack_fffffffffffffdd8);
        bVar2 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffdd0);
        if (bVar2) {
          *in_stack_00000018 = 1;
          local_8 = (Clause *)0x0;
          goto LAB_007bb889;
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x7bb639);
        Lib::Stack<Kernel::Literal_*>::push
                  (in_stack_fffffffffffffdd0,(Literal *)in_stack_fffffffffffffdc8._content);
      }
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::StlIter::operator++((StlIter *)in_stack_fffffffffffffdd0);
    }
    Kernel::Clause::iterLits((Clause *)in_stack_fffffffffffffde0._content);
    local_118 = local_130;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
             *)in_stack_fffffffffffffdc8._content);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_fffffffffffffdc8._content);
    while (in_stack_fffffffffffffe17 =
                Lib::operator!=((StlIter *)in_stack_fffffffffffffdd0,
                                (StlIter *)in_stack_fffffffffffffdc8._content),
          (bool)in_stack_fffffffffffffe17) {
      ppLVar6 = Lib::
                IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
                ::StlIter::operator*((StlIter *)0x7bb6f6);
      pLVar1 = *ppLVar6;
      if (pLVar1 != local_38) {
        pRVar5 = Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(in_stack_00000008);
        (*pRVar5->_vptr_ResultSubstitution[0x10])(pRVar5,pLVar1);
        bVar2 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffdd0);
        if (bVar2) {
          *in_stack_00000018 = 1;
          local_8 = (Clause *)0x0;
          goto LAB_007bb889;
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x7bb7b6);
        Lib::Stack<Kernel::Literal_*>::push
                  (in_stack_fffffffffffffdd0,(Literal *)in_stack_fffffffffffffdc8._content);
      }
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::StlIter::operator++((StlIter *)in_stack_fffffffffffffdd0);
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x7bb7f4);
    local_8 = Kernel::Clause::fromStack(lits,(Inference *)CONCAT17(uVar3,in_stack_fffffffffffffe38))
    ;
    Kernel::Inference::~Inference((Inference *)&stack0xfffffffffffffe68);
LAB_007bb889:
    local_90 = 1;
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  }
LAB_007bb8a7:
  anon_unknown.dwarf_d58a04::Applicator::~Applicator((Applicator *)0x7bb8b4);
  return local_8;
}

Assistant:

Clause* performRewriting(
    Clause *rwClause, Literal *rwLit, TermList rwTerm, Clause *eqClause,
    Literal *eqLit, TermList eqLHS, ResultSubstitutionSP subst,
    DemodulationHelper* helper, bool& isEqTautology, Inference&& inf)
{
  ASS(!eqLHS.isVar());

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // This should be the case for code trees
  ASS(subst->isIdentityOnQueryWhenResultBound());
  TermList tgtTermS = subst->applyToBoundResult(tgtTerm);

  Applicator appl(subst.ptr());

  if (helper && !helper->isPremiseRedundant(rwClause,rwLit,rwTerm,tgtTermS,eqLHS,&appl)) {
    return 0;
  }

  Literal *tgtLitS = EqHelper::replace(rwLit, rwTerm, tgtTermS);
  if (EqHelper::isEqTautology(tgtLitS)) {
    isEqTautology = true;
    return 0;
  }

  RStack<Literal*> resLits;

  resLits->push(tgtLitS);

  for (Literal *curr : rwClause->iterLits()) {
    if (curr == rwLit) {
      continue;
    }
    curr = EqHelper::replace(curr, rwTerm, tgtTermS);

    if (EqHelper::isEqTautology(curr)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(curr);
  }

  for (Literal* curr : eqClause->iterLits()) {
    if (curr == eqLit) {
      continue;
    }
    Literal* currAfter = subst->applyToBoundResult(curr);

    if (EqHelper::isEqTautology(currAfter)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(currAfter);
  }

  return Clause::fromStack(*resLits, inf);
}